

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O1

bool BlockStream_Read(TBlockStream *pStream,ULONGLONG *pByteOffset,void *pvBuffer,
                     DWORD dwBytesToRead)

{
  ULONGLONG *pUVar1;
  ulong uVar2;
  uint uVar3;
  BLOCK_READ p_Var4;
  ulong uVar5;
  BLOCK_CHECK p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  LPBYTE __ptr;
  ulong uVar11;
  int iVar12;
  int iVar13;
  DWORD dwErrCode;
  ulong uVar14;
  ulong local_98;
  LPBYTE local_88;
  ulong local_78;
  uint local_50;
  
  p_Var4 = (pStream->super_TFileStream).BlockRead;
  if (p_Var4 == (BLOCK_READ)0x0) {
    __assert_fail("pStream->BlockRead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x34f,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
  }
  if (dwBytesToRead == 0) {
    bVar8 = true;
  }
  else {
    pUVar1 = &(pStream->super_TFileStream).StreamPos;
    if (pByteOffset == (ULONGLONG *)0x0) {
      pByteOffset = pUVar1;
    }
    uVar5 = *pByteOffset;
    uVar2 = uVar5 + dwBytesToRead;
    if ((pStream->super_TFileStream).StreamSize < uVar2) {
      dwErrCode = 0x3ea;
    }
    else {
      uVar3 = pStream->BlockSize;
      uVar11 = (ulong)uVar3;
      if ((uVar3 & uVar3 - 1) != 0) {
        __assert_fail("(BlockSize & (BlockSize - 1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                      ,0x364,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
      }
      uVar14 = -uVar11 & uVar5;
      local_78 = uVar2 - uVar14;
      __ptr = (LPBYTE)malloc((ulong)((int)(((uVar3 - 1) + local_78) / uVar11) * uVar3));
      if (__ptr != (LPBYTE)0x0) {
        if (pStream->IsComplete == 0) {
          p_Var6 = (pStream->super_TFileStream).BlockCheck;
          if (p_Var6 == (BLOCK_CHECK)0x0) {
            __assert_fail("pStream->BlockCheck != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                          ,0x374,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)"
                         );
          }
          bVar8 = (*p_Var6)(&pStream->super_TFileStream,uVar14);
          local_98 = uVar14;
          local_88 = __ptr;
          if (uVar14 < uVar2) {
            iVar12 = -(int)uVar14;
            bVar7 = true;
            bVar10 = false;
            do {
              bVar9 = (*(pStream->super_TFileStream).BlockCheck)(&pStream->super_TFileStream,uVar14)
              ;
              if (bVar9 != bVar8) {
                iVar13 = (int)local_98;
                if ((((pStream->super_TFileStream).pMaster != (TFileStream *)0x0) &&
                    (pStream->pfnCallback != (STREAM_DOWNLOAD_CALLBACK)0x0)) && (bVar8 == false)) {
                  (*pStream->pfnCallback)(pStream->UserData,local_98,(int)uVar14 - iVar13);
                  bVar10 = true;
                }
                if (uVar14 <= local_98) {
                  __assert_fail("BlockOffset > BlockOffset0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                                ,0x388,
                                "bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)")
                  ;
                }
                bVar7 = (*(pStream->super_TFileStream).BlockRead)
                                  (&pStream->super_TFileStream,local_98,uVar14,local_88,
                                   (DWORD)local_78,bVar8);
                if (!bVar7) break;
                local_88 = local_88 + (uint)((int)uVar14 - iVar13);
                local_78 = (ulong)((DWORD)local_78 + iVar13 + iVar12);
                local_98 = uVar14;
                bVar8 = bVar9;
              }
              uVar14 = uVar14 + uVar11;
              iVar12 = iVar12 - uVar3;
            } while (uVar14 < uVar2);
          }
          else {
            bVar7 = true;
            bVar10 = false;
          }
          if (local_98 < uVar14) {
            if ((((pStream->super_TFileStream).pMaster != (TFileStream *)0x0) &&
                (pStream->pfnCallback != (STREAM_DOWNLOAD_CALLBACK)0x0)) && (bVar8 == false)) {
              (*pStream->pfnCallback)(pStream->UserData,local_98,(int)uVar14 - (int)local_98);
              bVar10 = true;
            }
            uVar11 = (pStream->super_TFileStream).StreamSize;
            if (uVar14 < uVar11) {
              uVar11 = uVar14;
            }
            bVar7 = (*(pStream->super_TFileStream).BlockRead)
                              (&pStream->super_TFileStream,local_98,uVar11,local_88,(DWORD)local_78,
                               bVar8);
          }
        }
        else {
          bVar7 = (*p_Var4)(&pStream->super_TFileStream,uVar14,uVar2,__ptr,(DWORD)local_78,true);
          bVar10 = false;
        }
        if (bVar7 == false) {
          SetLastError(0x3ee);
        }
        else {
          local_50 = (uint)uVar5;
          memcpy(pvBuffer,__ptr + (uVar3 - 1 & local_50),(ulong)dwBytesToRead);
          *pUVar1 = uVar2;
        }
        if (bVar10) {
          (*pStream->pfnCallback)(pStream->UserData,0,0);
        }
        free(__ptr);
        return bVar7;
      }
      dwErrCode = 0xc;
    }
    SetLastError(dwErrCode);
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

static bool BlockStream_Read(
    TBlockStream * pStream,                 // Pointer to an open stream
    ULONGLONG * pByteOffset,                // Pointer to file byte offset. If NULL, it reads from the current position
    void * pvBuffer,                        // Pointer to data to be read
    DWORD dwBytesToRead)                    // Number of bytes to read from the file
{
    ULONGLONG BlockOffset0;
    ULONGLONG BlockOffset;
    ULONGLONG ByteOffset;
    ULONGLONG EndOffset;
    LPBYTE TransferBuffer;
    LPBYTE BlockBuffer;
    DWORD BlockBufferOffset;                // Offset of the desired data in the block buffer
    DWORD BytesNeeded;                      // Number of bytes that really need to be read
    DWORD BlockSize = pStream->BlockSize;
    DWORD BlockCount;
    bool bPrevBlockAvailable;
    bool bCallbackCalled = false;
    bool bBlockAvailable;
    bool bResult = true;

    // The base block read function must be present
    assert(pStream->BlockRead != NULL);

    // NOP reading of zero bytes
    if(dwBytesToRead == 0)
        return true;

    // Get the current position in the stream
    ByteOffset = (pByteOffset != NULL) ? pByteOffset[0] : pStream->StreamPos;
    EndOffset = ByteOffset + dwBytesToRead;
    if(EndOffset > pStream->StreamSize)
    {
        SetLastError(ERROR_HANDLE_EOF);
        return false;
    }

    // Calculate the block parameters
    BlockOffset0 = BlockOffset = ByteOffset & ~((ULONGLONG)BlockSize - 1);
    BlockCount  = (DWORD)(((EndOffset - BlockOffset) + (BlockSize - 1)) / BlockSize);
    BytesNeeded = (DWORD)(EndOffset - BlockOffset);

    // Remember where we have our data
    assert((BlockSize & (BlockSize - 1)) == 0);
    BlockBufferOffset = (DWORD)(ByteOffset & (BlockSize - 1));

    // Allocate buffer for reading blocks
    TransferBuffer = BlockBuffer = CASC_ALLOC(BYTE, (BlockCount * BlockSize));
    if(TransferBuffer == NULL)
    {
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return false;
    }

    // If all blocks are available, just read all blocks at once
    if(pStream->IsComplete == 0)
    {
        // Now parse the blocks and send the block read request
        // to all blocks with the same availability
        assert(pStream->BlockCheck != NULL);
        bPrevBlockAvailable = pStream->BlockCheck(pStream, BlockOffset);

        // Loop as long as we have something to read
        while(BlockOffset < EndOffset)
        {
            // Determine availability of the next block
            bBlockAvailable = pStream->BlockCheck(pStream, BlockOffset);

            // If the availability has changed, read all blocks up to this one
            if(bBlockAvailable != bPrevBlockAvailable)
            {
                // Call the file stream callback, if the block is not available
                if(pStream->pMaster && pStream->pfnCallback && bPrevBlockAvailable == false)
                {
                    pStream->pfnCallback(pStream->UserData, BlockOffset0, (DWORD)(BlockOffset - BlockOffset0));
                    bCallbackCalled = true;
                }

                // Load the continuous blocks with the same availability
                assert(BlockOffset > BlockOffset0);
                bResult = pStream->BlockRead(pStream, BlockOffset0, BlockOffset, BlockBuffer, BytesNeeded, bPrevBlockAvailable);
                if(!bResult)
                    break;

                // Move the block offset
                BlockBuffer += (DWORD)(BlockOffset - BlockOffset0);
                BytesNeeded -= (DWORD)(BlockOffset - BlockOffset0);
                bPrevBlockAvailable = bBlockAvailable;
                BlockOffset0 = BlockOffset;
            }

            // Move to the block offset in the stream
            BlockOffset += BlockSize;
        }

        // If there is a block(s) remaining to be read, do it
        if(BlockOffset > BlockOffset0)
        {
            // Call the file stream callback, if the block is not available
            if(pStream->pMaster && pStream->pfnCallback && bPrevBlockAvailable == false)
            {
                pStream->pfnCallback(pStream->UserData, BlockOffset0, (DWORD)(BlockOffset - BlockOffset0));
                bCallbackCalled = true;
            }

            // Read the complete blocks from the file
            if(BlockOffset > pStream->StreamSize)
                BlockOffset = pStream->StreamSize;
            bResult = pStream->BlockRead(pStream, BlockOffset0, BlockOffset, BlockBuffer, BytesNeeded, bPrevBlockAvailable);
        }
    }
    else
    {
        // Read the complete blocks from the file
        if(EndOffset > pStream->StreamSize)
            EndOffset = pStream->StreamSize;
        bResult = pStream->BlockRead(pStream, BlockOffset, EndOffset, BlockBuffer, BytesNeeded, true);
    }

    // Now copy the data to the user buffer
    if(bResult)
    {
        memcpy(pvBuffer, TransferBuffer + BlockBufferOffset, dwBytesToRead);
        pStream->StreamPos = ByteOffset + dwBytesToRead;
    }
    else
    {
        // If the block read failed, set the last error
        SetLastError(ERROR_FILE_INCOMPLETE);
    }

    // Call the callback to indicate we are done
    if(bCallbackCalled)
        pStream->pfnCallback(pStream->UserData, 0, 0);

    // Free the block buffer and return
    CASC_FREE(TransferBuffer);
    return bResult;
}